

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O1

GLXContext glfwGetGLXContext(GLFWwindow *handle)

{
  char *format;
  int code;
  
  if (_glfw.initialized == 0) {
    code = 0x10001;
  }
  else {
    if (_glfw.platform.platformID != 0x60004) {
      format = "GLX: Platform not initialized";
      code = 0x1000e;
      goto LAB_001cd2ef;
    }
    if (*(int *)(handle + 0x214) == 0x36001) {
      return *(GLXContext *)(handle + 0x2c0);
    }
    code = 0x1000a;
  }
  format = (char *)0x0;
LAB_001cd2ef:
  _glfwInputError(code,format);
  return (GLXContext)0x0;
}

Assistant:

GLFWAPI GLXContext glfwGetGLXContext(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (_glfw.platform.platformID != GLFW_PLATFORM_X11)
    {
        _glfwInputError(GLFW_PLATFORM_UNAVAILABLE, "GLX: Platform not initialized");
        return NULL;
    }

    if (window->context.source != GLFW_NATIVE_CONTEXT_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return NULL;
    }

    return window->context.glx.handle;
}